

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall helics::Input::forceCoreDataUpdate(Input *this)

{
  bool bVar1;
  MultiInputHandlingMethod MVar2;
  ValueFederate *in_RDI;
  data_view dv;
  defV *in_stack_000000d0;
  DataType in_stack_000000dc;
  data_view *in_stack_000000e0;
  undefined6 in_stack_ffffffffffffffb8;
  ValueFederate *in_stack_ffffffffffffffc8;
  
  if (*(ValueFederate **)&in_RDI->field_0x38 != (ValueFederate *)0x0) {
    helics::ValueFederate::getBytes(in_stack_ffffffffffffffc8,(Input *)in_RDI);
    bVar1 = data_view::empty((data_view *)0x38c7ec);
    if (bVar1) {
      MVar2 = getMultiInputMode((Input *)in_RDI);
      if (MVar2 != NO_OP) {
        helics::ValueFederate::forceCoreUpdate
                  (in_RDI,(Input *)CONCAT26(MVar2,in_stack_ffffffffffffffb8));
      }
    }
    else {
      helics::valueExtract(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
    }
    data_view::~data_view((data_view *)0x38c860);
  }
  return;
}

Assistant:

void Input::forceCoreDataUpdate()
{
    if (fed == nullptr) {
        return;
    }
    auto dv = fed->getBytes(*this);
    if (!dv.empty()) {
        valueExtract(dv, injectionType, lastValue);
    } else if (getMultiInputMode() != MultiInputHandlingMethod::NO_OP) {
        fed->forceCoreUpdate(*this);
    }
}